

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMModel.hpp
# Opt level: O0

void __thiscall cppjieba::HMMModel::LoadModel(HMMModel *this,string *filePath)

{
  pointer *this_00;
  size_t sVar1;
  byte bVar2;
  bool bVar3;
  undefined8 uVar4;
  ostream *poVar5;
  size_type sVar6;
  char *pcVar7;
  double dVar8;
  Logger local_1668;
  Logger local_14e8;
  Logger local_1368;
  Logger local_11e8;
  Logger local_1068;
  Logger local_ee8;
  Logger local_d68;
  Logger local_be8;
  ulong local_a68;
  size_t j_1;
  allocator local_8d9;
  string local_8d8 [32];
  Logger local_8b8;
  ulong local_738;
  size_t i;
  size_t j;
  allocator local_5a1;
  string local_5a0 [32];
  Logger local_580;
  undefined1 local_400 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tmp2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tmp;
  string line;
  Logger local_3b0;
  ifstream local_220 [8];
  ifstream ifile;
  string *filePath_local;
  HMMModel *this_local;
  
  uVar4 = std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_220,uVar4,8);
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    limonp::Logger::Logger
              (&local_3b0,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/HMMModel.hpp"
               ,0x24);
    poVar5 = limonp::Logger::Stream(&local_3b0);
    poVar5 = std::operator<<(poVar5,"exp: [ifile.is_open()");
    poVar5 = std::operator<<(poVar5,"] false. ");
    poVar5 = std::operator<<(poVar5,"open ");
    poVar5 = std::operator<<(poVar5,(string *)filePath);
    std::operator<<(poVar5," failed");
    limonp::Logger::~Logger(&local_3b0);
  }
  this_00 = &tmp.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::string((string *)this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&tmp2.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_400);
  bVar3 = GetLine(this,local_220,(string *)this_00);
  if (!bVar3) {
    limonp::Logger::Logger
              (&local_580,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/HMMModel.hpp"
               ,0x29);
    poVar5 = limonp::Logger::Stream(&local_580);
    poVar5 = std::operator<<(poVar5,"exp: [GetLine(ifile, line)");
    std::operator<<(poVar5,"] false. ");
    limonp::Logger::~Logger(&local_580);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5a0," ",&local_5a1);
  limonp::Split((string *)
                &tmp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&tmp2.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_5a0,
                0xffffffffffffffff);
  std::__cxx11::string::~string(local_5a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&tmp2.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (sVar6 != 4) {
    limonp::Logger::Logger
              ((Logger *)&j,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/HMMModel.hpp"
               ,0x2b);
    poVar5 = limonp::Logger::Stream((Logger *)&j);
    poVar5 = std::operator<<(poVar5,"exp: [tmp.size() == STATUS_SUM");
    std::operator<<(poVar5,"] false. ");
    limonp::Logger::~Logger((Logger *)&j);
  }
  i = 0;
  while( true ) {
    sVar1 = i;
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&tmp2.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar6 <= sVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&tmp2.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,i);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    dVar8 = atof(pcVar7);
    this->startProb[i] = dVar8;
    i = i + 1;
  }
  for (local_738 = 0; local_738 < 4; local_738 = local_738 + 1) {
    bVar3 = GetLine(this,local_220,
                    (string *)
                    &tmp.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar3) {
      limonp::Logger::Logger
                (&local_8b8,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/HMMModel.hpp"
                 ,0x32);
      poVar5 = limonp::Logger::Stream(&local_8b8);
      poVar5 = std::operator<<(poVar5,"exp: [GetLine(ifile, line)");
      std::operator<<(poVar5,"] false. ");
      limonp::Logger::~Logger(&local_8b8);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8d8," ",&local_8d9);
    limonp::Split((string *)
                  &tmp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&tmp2.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_8d8,
                  0xffffffffffffffff);
    std::__cxx11::string::~string(local_8d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&tmp2.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar6 != 4) {
      limonp::Logger::Logger
                ((Logger *)&j_1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/HMMModel.hpp"
                 ,0x34);
      poVar5 = limonp::Logger::Stream((Logger *)&j_1);
      poVar5 = std::operator<<(poVar5,"exp: [tmp.size() == STATUS_SUM");
      std::operator<<(poVar5,"] false. ");
      limonp::Logger::~Logger((Logger *)&j_1);
    }
    for (local_a68 = 0; local_a68 < 4; local_a68 = local_a68 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&tmp2.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,local_a68);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      dVar8 = atof(pcVar7);
      this->transProb[local_738][local_a68] = dVar8;
    }
  }
  bVar3 = GetLine(this,local_220,
                  (string *)
                  &tmp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (!bVar3) {
    limonp::Logger::Logger
              (&local_be8,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/HMMModel.hpp"
               ,0x3b);
    poVar5 = limonp::Logger::Stream(&local_be8);
    poVar5 = std::operator<<(poVar5,"exp: [GetLine(ifile, line)");
    std::operator<<(poVar5,"] false. ");
    limonp::Logger::~Logger(&local_be8);
  }
  bVar3 = LoadEmitProb(this,(string *)
                            &tmp.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->emitProbB);
  if (!bVar3) {
    limonp::Logger::Logger
              (&local_d68,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/HMMModel.hpp"
               ,0x3c);
    poVar5 = limonp::Logger::Stream(&local_d68);
    poVar5 = std::operator<<(poVar5,"exp: [LoadEmitProb(line, emitProbB)");
    std::operator<<(poVar5,"] false. ");
    limonp::Logger::~Logger(&local_d68);
  }
  bVar3 = GetLine(this,local_220,
                  (string *)
                  &tmp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (!bVar3) {
    limonp::Logger::Logger
              (&local_ee8,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/HMMModel.hpp"
               ,0x3f);
    poVar5 = limonp::Logger::Stream(&local_ee8);
    poVar5 = std::operator<<(poVar5,"exp: [GetLine(ifile, line)");
    std::operator<<(poVar5,"] false. ");
    limonp::Logger::~Logger(&local_ee8);
  }
  bVar3 = LoadEmitProb(this,(string *)
                            &tmp.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->emitProbE);
  if (!bVar3) {
    limonp::Logger::Logger
              (&local_1068,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/HMMModel.hpp"
               ,0x40);
    poVar5 = limonp::Logger::Stream(&local_1068);
    poVar5 = std::operator<<(poVar5,"exp: [LoadEmitProb(line, emitProbE)");
    std::operator<<(poVar5,"] false. ");
    limonp::Logger::~Logger(&local_1068);
  }
  bVar3 = GetLine(this,local_220,
                  (string *)
                  &tmp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (!bVar3) {
    limonp::Logger::Logger
              (&local_11e8,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/HMMModel.hpp"
               ,0x43);
    poVar5 = limonp::Logger::Stream(&local_11e8);
    poVar5 = std::operator<<(poVar5,"exp: [GetLine(ifile, line)");
    std::operator<<(poVar5,"] false. ");
    limonp::Logger::~Logger(&local_11e8);
  }
  bVar3 = LoadEmitProb(this,(string *)
                            &tmp.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->emitProbM);
  if (!bVar3) {
    limonp::Logger::Logger
              (&local_1368,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/HMMModel.hpp"
               ,0x44);
    poVar5 = limonp::Logger::Stream(&local_1368);
    poVar5 = std::operator<<(poVar5,"exp: [LoadEmitProb(line, emitProbM)");
    std::operator<<(poVar5,"] false. ");
    limonp::Logger::~Logger(&local_1368);
  }
  bVar3 = GetLine(this,local_220,
                  (string *)
                  &tmp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (!bVar3) {
    limonp::Logger::Logger
              (&local_14e8,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/HMMModel.hpp"
               ,0x47);
    poVar5 = limonp::Logger::Stream(&local_14e8);
    poVar5 = std::operator<<(poVar5,"exp: [GetLine(ifile, line)");
    std::operator<<(poVar5,"] false. ");
    limonp::Logger::~Logger(&local_14e8);
  }
  bVar3 = LoadEmitProb(this,(string *)
                            &tmp.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->emitProbS);
  if (!bVar3) {
    limonp::Logger::Logger
              (&local_1668,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/HMMModel.hpp"
               ,0x48);
    poVar5 = limonp::Logger::Stream(&local_1668);
    poVar5 = std::operator<<(poVar5,"exp: [LoadEmitProb(line, emitProbS)");
    std::operator<<(poVar5,"] false. ");
    limonp::Logger::~Logger(&local_1668);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_400);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&tmp2.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &tmp.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::ifstream::~ifstream(local_220);
  return;
}

Assistant:

void LoadModel(const string& filePath) {
    ifstream ifile(filePath.c_str());
    XCHECK(ifile.is_open()) << "open " << filePath << " failed";
    string line;
    vector<string> tmp;
    vector<string> tmp2;
    //Load startProb
    XCHECK(GetLine(ifile, line));
    Split(line, tmp, " ");
    XCHECK(tmp.size() == STATUS_SUM);
    for (size_t j = 0; j< tmp.size(); j++) {
      startProb[j] = atof(tmp[j].c_str());
    }

    //Load transProb
    for (size_t i = 0; i < STATUS_SUM; i++) {
      XCHECK(GetLine(ifile, line));
      Split(line, tmp, " ");
      XCHECK(tmp.size() == STATUS_SUM);
      for (size_t j =0; j < STATUS_SUM; j++) {
        transProb[i][j] = atof(tmp[j].c_str());
      }
    }

    //Load emitProbB
    XCHECK(GetLine(ifile, line));
    XCHECK(LoadEmitProb(line, emitProbB));

    //Load emitProbE
    XCHECK(GetLine(ifile, line));
    XCHECK(LoadEmitProb(line, emitProbE));

    //Load emitProbM
    XCHECK(GetLine(ifile, line));
    XCHECK(LoadEmitProb(line, emitProbM));

    //Load emitProbS
    XCHECK(GetLine(ifile, line));
    XCHECK(LoadEmitProb(line, emitProbS));
  }